

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rasterizer.hpp
# Opt level: O1

void __thiscall
eos::render::Rasterizer<eos::render::ExtractionFragmentShader>::raster_triangle<double>
          (Rasterizer<eos::render::ExtractionFragmentShader> *this,Vertex<double> *point_a,
          Vertex<double> *point_b,Vertex<double> *point_c,optional<eos::render::Texture> *texture)

{
  double dVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  int *piVar5;
  double dVar6;
  float fVar7;
  Image<eos::core::Pixel<unsigned_char,_4>_> *this_00;
  double *pdVar8;
  Pixel<unsigned_char,_4> *pPVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float dudx;
  double dVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  double dVar31;
  float fVar32;
  double dVar33;
  float fVar34;
  Rect<int> RVar35;
  ulong local_1c0;
  Vector4<double> local_178;
  plane gamma_plane;
  plane beta_plane;
  plane alpha_plane;
  Vector3<double> lambda;
  Vector3<double> local_e8;
  ulong local_d0;
  Image<eos::core::Pixel<unsigned_char,_4>_> *local_c8;
  Vertex<double> *local_c0;
  Vertex<double> *local_b8;
  optional<eos::render::Texture> *local_b0;
  double local_a8;
  double local_a0;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  RVar35 = detail::calculate_clipped_bounding_box<double>
                     ((Vector2<double> *)&local_178,(Vector2<double> *)&lambda,
                      (Vector2<double> *)&local_e8,this->viewport_width,this->viewport_height);
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  detail::plane::plane<double>(&alpha_plane,(Vector3<double> *)&local_178,&lambda,&local_e8);
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  detail::plane::plane<double>(&beta_plane,(Vector3<double> *)&local_178,&lambda,&local_e8);
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  detail::plane::plane<double>(&gamma_plane,(Vector3<double> *)&local_178,&lambda,&local_e8);
  if (-1 < RVar35._8_8_) {
    fVar19 = 1.0 / alpha_plane.c;
    fVar22 = 1.0 / beta_plane.c;
    fVar15 = 1.0 / gamma_plane.c;
    local_48 = -alpha_plane.a * fVar19;
    uStack_44 = 0x80000000;
    uStack_40 = 0x80000000;
    uStack_3c = 0x80000000;
    local_68 = -beta_plane.a * fVar22;
    uStack_64 = 0x80000000;
    uStack_60 = 0x80000000;
    uStack_5c = 0x80000000;
    local_88 = -gamma_plane.a * fVar15;
    uStack_84 = 0x80000000;
    uStack_80 = 0x80000000;
    uStack_7c = 0x80000000;
    local_58 = -alpha_plane.b * fVar19;
    uStack_54 = 0x80000000;
    uStack_50 = 0x80000000;
    uStack_4c = 0x80000000;
    local_78 = -beta_plane.b * fVar22;
    uStack_74 = 0x80000000;
    uStack_70 = 0x80000000;
    uStack_6c = 0x80000000;
    local_98 = -gamma_plane.b * fVar15;
    uStack_94 = 0x80000000;
    uStack_90 = 0x80000000;
    uStack_8c = 0x80000000;
    local_1c0 = RVar35._0_8_ >> 0x20;
    uVar12 = RVar35.height + RVar35.y;
    iVar10 = RVar35.x;
    iVar13 = iVar10 + RVar35.width;
    if (iVar13 <= iVar10) {
      iVar13 = iVar10;
    }
    local_d0 = (ulong)uVar12;
    if ((int)uVar12 <= RVar35.y) {
      local_d0 = local_1c0;
    }
    local_c8 = &this->colorbuffer;
    local_c0 = point_b;
    local_b8 = point_c;
    local_b0 = texture;
    do {
      if (-1 < RVar35.width) {
        fVar16 = (float)(int)local_1c0 + 0.5;
        dVar20 = (double)fVar16;
        uVar11 = RVar35._0_8_ & 0xffffffff;
        do {
          iVar10 = (int)uVar11;
          fVar34 = (float)iVar10 + 0.5;
          dVar33 = (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0];
          dVar18 = (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[1];
          dVar21 = (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0];
          dVar1 = (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[0];
          dVar2 = (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[1];
          dVar3 = (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[1];
          dVar30 = (double)fVar34;
          dVar31 = ((dVar18 - dVar3) * dVar30 + (dVar21 - dVar33) * dVar20 + dVar33 * dVar3 +
                   -dVar21 * dVar18) *
                   (1.0 / ((double)(float)dVar1 * (dVar18 - dVar3) +
                           (double)(float)dVar2 * (dVar21 - dVar33) + dVar33 * dVar3 +
                          -dVar21 * dVar18));
          if (((0.0 <= dVar31) &&
              (dVar6 = ((dVar3 - dVar2) * dVar30 + (dVar1 - dVar21) * dVar20 + dVar21 * dVar2 +
                       -dVar1 * dVar3) *
                       (1.0 / ((double)(float)dVar33 * (dVar3 - dVar2) +
                               (double)(float)dVar18 * (dVar1 - dVar21) + dVar21 * dVar2 +
                              -dVar1 * dVar3)), 0.0 <= dVar6)) &&
             (dVar33 = ((dVar2 - dVar18) * dVar30 + (dVar33 - dVar1) * dVar20 + dVar1 * dVar18 +
                       -dVar33 * dVar2) *
                       (1.0 / ((double)(float)dVar21 * (dVar2 - dVar18) +
                               (double)(float)dVar3 * (dVar33 - dVar1) + dVar1 * dVar18 +
                              -dVar33 * dVar2)), 0.0 <= dVar33)) {
            dVar18 = (point_c->position).
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                     array[2] * dVar31 +
                     (point_a->position).
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                     array[2] * dVar6 +
                     (point_b->position).
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                     array[2] * dVar33;
            cVar4 = this->enable_depth_test;
            if ((bool)cVar4 == true) {
              bVar14 = this->enable_far_clipping;
              local_a8 = dVar33;
              local_a0 = dVar6;
              pdVar8 = core::Image<double>::operator()(&this->depthbuffer,(int)local_1c0,iVar10);
              dVar33 = local_a8;
              dVar6 = local_a0;
              if ((byte)(*pdVar8 <= dVar18 | 1.0 < dVar18 & bVar14) == 1) {
                cVar4 = this->enable_depth_test;
                goto joined_r0x0016ceaa;
              }
            }
            else {
joined_r0x0016ceaa:
              if (cVar4 != '\0') goto LAB_0016d20e;
            }
            if (this->perspective_correct_barycentric_weights == true) {
              dVar21 = (point_a->position).
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[3];
              dVar1 = (point_b->position).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[3];
              dVar2 = (point_c->position).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[3];
              dVar3 = 1.0 / (dVar31 * dVar2 + dVar6 * dVar21 + dVar33 * dVar1);
              dVar6 = dVar6 * dVar21 * dVar3;
              dVar33 = dVar33 * dVar1 * dVar3;
              dVar31 = dVar31 * dVar3 * dVar2;
            }
            lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = dVar6;
            lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = dVar33;
            lambda.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = dVar31;
            if ((texture->super__Optional_base<eos::render::Texture,_false,_false>)._M_payload.
                super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                super__Optional_payload_base<eos::render::Texture>._M_engaged == true) {
              if ((texture->super__Optional_base<eos::render::Texture,_false,_false>)._M_payload.
                  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                  super__Optional_payload_base<eos::render::Texture>._M_engaged == false) {
                std::__throw_bad_optional_access();
              }
              fVar17 = -(gamma_plane.a * fVar34 + gamma_plane.b * fVar16 + gamma_plane.d) * fVar15;
              fVar25 = (beta_plane.a * fVar34 + beta_plane.b * fVar16 + beta_plane.d) * fVar22;
              fVar7 = 1.0 / (fVar17 * fVar17);
              fVar32 = (alpha_plane.a * fVar34 + alpha_plane.b * fVar16 + alpha_plane.d) * fVar19;
              piVar5 = *(int **)&(texture->super__Optional_base<eos::render::Texture,_false,_false>)
                                 ._M_payload.
                                 super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                                 super__Optional_payload_base<eos::render::Texture>._M_payload.
                                 _M_value.mipmaps.
                                 super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
              ;
              fVar26 = (float)piVar5[1];
              dudx = (fVar17 * local_48 + fVar32 * local_88) * fVar7 * fVar26;
              fVar26 = (local_68 * fVar17 + fVar25 * local_88) * fVar7 * fVar26;
              fVar27 = (float)*piVar5;
              fVar32 = (local_58 * fVar17 + local_98 * fVar32) * fVar7 * fVar27;
              fVar27 = (local_78 * fVar17 + local_98 * fVar25) * fVar7 * fVar27;
            }
            else {
              dudx = 0.0;
              fVar26 = 0.0;
              fVar32 = 0.0;
              fVar27 = 0.0;
            }
            ExtractionFragmentShader::shade_triangle_pixel<double>
                      (&local_178,(ExtractionFragmentShader *)this,(int)fVar34,(int)fVar16,point_a,
                       point_b,point_c,&lambda,texture,dudx,fVar26,fVar32,fVar27);
            this_00 = local_c8;
            uVar23 = 0;
            uVar24 = 0x3ff00000;
            uVar28 = uVar23;
            uVar29 = uVar24;
            if (local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[0] <= 1.0) {
              uVar28 = SUB84(local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array[0],0);
              uVar29 = (undefined4)
                       ((ulong)local_178.
                               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                               m_storage.m_data.array[0] >> 0x20);
            }
            if (local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[1] <= 1.0) {
              uVar23 = SUB84(local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array[1],0);
              uVar24 = (undefined4)
                       ((ulong)local_178.
                               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                               m_storage.m_data.array[1] >> 0x20);
            }
            dVar33 = 1.0;
            if (local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[2] <= 1.0) {
              dVar33 = local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[2];
            }
            dVar21 = 1.0;
            if (local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[3] <= 1.0) {
              dVar21 = local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[3];
            }
            pPVar9 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                               (local_c8,(int)local_1c0,iVar10);
            (pPVar9->data_)._M_elems[0] = (uchar)(int)(dVar33 * 255.0);
            pPVar9 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                               (this_00,(int)local_1c0,iVar10);
            (pPVar9->data_)._M_elems[1] = (uchar)(int)((double)CONCAT44(uVar24,uVar23) * 255.0);
            pPVar9 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                               (this_00,(int)local_1c0,iVar10);
            (pPVar9->data_)._M_elems[2] = (uchar)(int)((double)CONCAT44(uVar29,uVar28) * 255.0);
            pPVar9 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                               (this_00,(int)local_1c0,iVar10);
            (pPVar9->data_)._M_elems[3] = (uchar)(int)(dVar21 * 255.0);
            point_b = local_c0;
            texture = local_b0;
            point_c = local_b8;
            if (this->enable_depth_test == true) {
              pdVar8 = core::Image<double>::operator()(&this->depthbuffer,(int)local_1c0,iVar10);
              *pdVar8 = dVar18;
              point_b = local_c0;
              texture = local_b0;
              point_c = local_b8;
            }
          }
LAB_0016d20e:
          uVar11 = (ulong)(iVar10 + 1U);
        } while (iVar13 + 1U != iVar10 + 1U);
      }
      bVar14 = (int)local_1c0 != (int)local_d0;
      local_1c0 = (ulong)((int)local_1c0 + 1);
    } while (bVar14);
  }
  return;
}

Assistant:

void raster_triangle(const detail::Vertex<T>& point_a, const detail::Vertex<T>& point_b,
                         const detail::Vertex<T>& point_c, const cpp17::optional<Texture>& texture)
    {
        // We already calculated this in the culling/clipping stage. Maybe we should save/cache it after all.
        const auto boundingBox = detail::calculate_clipped_bounding_box(
            Eigen::Vector2<T>(point_a.position.x(), point_a.position.y()),
            Eigen::Vector2<T>(point_b.position.x(), point_b.position.y()),
            Eigen::Vector2<T>(point_c.position.x(), point_c.position.y()), viewport_width, viewport_height);
        const auto min_x = boundingBox.x;
        const auto max_x = boundingBox.x + boundingBox.width;
        const auto min_y = boundingBox.y;
        const auto max_y = boundingBox.y + boundingBox.height;

        // These are triangle-specific, i.e. calculate once per triangle.
        // These ones are needed for perspective correct lambdas! (as well as mipmapping)
        const auto& one_over_w0 = point_a.position[3];
        const auto& one_over_w1 = point_b.position[3];
        const auto& one_over_w2 = point_c.position[3];

        // These are triangle-specific, i.e. calculate once per triangle.
        // For partial derivatives computation (for mipmapping, texturing) (they work on screen-space coords):
        using eos::render::detail::plane;
        const auto alpha_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[0] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[0] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[0] * one_over_w2));
        const auto beta_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[1] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[1] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[1] * one_over_w2));
        const auto gamma_plane =
            plane(Eigen::Vector3<T>(point_a.position[0], point_a.position[1], one_over_w0),
                  Eigen::Vector3<T>(point_b.position[0], point_b.position[1], one_over_w1),
                  Eigen::Vector3<T>(point_c.position[0], point_c.position[1], one_over_w2));
        const auto one_over_alpha_c = 1.0f / alpha_plane.c;
        const auto one_over_beta_c = 1.0f / beta_plane.c;
        const auto one_over_gamma_c = 1.0f / gamma_plane.c;
        const auto alpha_ffx = -alpha_plane.a * one_over_alpha_c;
        const auto beta_ffx = -beta_plane.a * one_over_beta_c;
        const auto gamma_ffx = -gamma_plane.a * one_over_gamma_c;
        const auto alpha_ffy = -alpha_plane.b * one_over_alpha_c;
        const auto beta_ffy = -beta_plane.b * one_over_beta_c;
        const auto gamma_ffy = -gamma_plane.b * one_over_gamma_c;

        for (int yi = min_y; yi <= max_y; ++yi)
        {
            for (int xi = min_x; xi <= max_x; ++xi)
            {
                // we want centers of pixels to be used in computations. Todo: Do we? Do we pass it with or
                // without +0.5 to the FragShader?
                const float x = static_cast<float>(xi) + 0.5f; // double? T?
                const float y = static_cast<float>(yi) + 0.5f;

                // These will be used for barycentric weights computation
                using detail::implicit_line;
                const double one_over_v0ToLine12 =
                    1.0 / implicit_line(point_a.position[0], point_a.position[1], point_b.position,
                                        point_c.position);
                const double one_over_v1ToLine20 =
                    1.0 / implicit_line(point_b.position[0], point_b.position[1], point_c.position,
                                        point_a.position);
                const double one_over_v2ToLine01 =
                    1.0 / implicit_line(point_c.position[0], point_c.position[1], point_a.position,
                                        point_b.position);
                // Affine barycentric weights:
                double alpha = implicit_line(x, y, point_b.position, point_c.position) * one_over_v0ToLine12;
                double beta = implicit_line(x, y, point_c.position, point_a.position) * one_over_v1ToLine20;
                double gamma = implicit_line(x, y, point_a.position, point_b.position) * one_over_v2ToLine01;

                // if pixel (x, y) is inside the triangle or on one of its edges
                if (alpha >= 0 && beta >= 0 && gamma >= 0)
                {
                    const int pixel_index_row = yi;
                    const int pixel_index_col = xi;

                    // TODO: Check this one. What about perspective?
                    const double z_affine = alpha * static_cast<double>(point_a.position[2]) +
                                            beta * static_cast<double>(point_b.position[2]) +
                                            gamma * static_cast<double>(point_c.position[2]);

                    bool draw = true;
                    if (enable_far_clipping)
                    {
                        if (z_affine > 1.0)
                        {
                            draw = false;
                        }
                    }

                    bool passes_depth_test = false;
                    if (enable_depth_test)
                    {
                        // If enable_depth_test=false, avoid accessing the depthbuffer at all - it might be
                        // empty or have other dimensions.
                        passes_depth_test =
                            (z_affine < depthbuffer(pixel_index_row, pixel_index_col));
                    }
                    // The '<= 1.0' clips against the far-plane in NDC. We clip against the near-plane
                    // earlier.
                    // if (z_affine < depthbuffer.at<double>(pixelIndexRow, pixelIndexCol)/* && z_affine <=
                    // 1.0*/) // what to do in ortho case without n/f "squashing"? should we always squash? or
                    // a flag?
                    if ((passes_depth_test && draw) || enable_depth_test == false)
                    {
                        // perspective-correct barycentric weights
                        // Todo: Check this in the original/older implementation, i.e. if all is still
                        //   perspective-correct. I think so. Also compare 1:1 with OpenGL.
                        // This is the default case when rendering - we perspectively correct the barycentric
                        //   weights. However when extracting texture, it seems we don't want to do that, and
                        //   pass the uncorrected lambda in that case. This switch allows us to do that.
                        if (perspective_correct_barycentric_weights)
                        {
                            double d = alpha * one_over_w0 + beta * one_over_w1 + gamma * one_over_w2;
                            d = 1.0 / d;
                            alpha *= d * one_over_w0; // In case of affine cam matrix, everything is 1 and
                                                      // a/b/g don't get changed.
                            beta *= d * one_over_w1;
                            gamma *= d * one_over_w2;
                        }
                        Eigen::Vector3<T> lambda(alpha, beta, gamma);

                        Eigen::Vector4<T> pixel_color;
                        if (texture)
                        {
                            // check if texture != NULL?
                            // partial derivatives (for mip-mapping, not needed for texturing otherwise!)
                            const float u_over_z =
                                -(alpha_plane.a * x + alpha_plane.b * y + alpha_plane.d) * one_over_alpha_c;
                            const float v_over_z =
                                -(beta_plane.a * x + beta_plane.b * y + beta_plane.d) * one_over_beta_c;
                            const float one_over_z =
                                -(gamma_plane.a * x + gamma_plane.b * y + gamma_plane.d) * one_over_gamma_c;
                            const float one_over_squared_one_over_z = 1.0f / std::pow(one_over_z, 2);

                            // partial derivatives of U/V coordinates with respect to X/Y pixel's screen
                            // coordinates
                            // These are exclusively used for the mipmap level computation (i.e. which mipmap
                            // levels to use).
                            // They're not needed for texturing otherwise at all!
                            float dudx =
                                one_over_squared_one_over_z * (alpha_ffx * one_over_z - u_over_z * gamma_ffx);
                            float dudy =
                                one_over_squared_one_over_z * (beta_ffx * one_over_z - v_over_z * gamma_ffx);
                            float dvdx =
                                one_over_squared_one_over_z * (alpha_ffy * one_over_z - u_over_z * gamma_ffy);
                            float dvdy =
                                one_over_squared_one_over_z * (beta_ffy * one_over_z - v_over_z * gamma_ffy);
                            dudx *= texture.value().mipmaps[0].width();
                            dudy *= texture.value().mipmaps[0].width();
                            dvdx *= texture.value().mipmaps[0].height();
                            dvdy *= texture.value().mipmaps[0].height();

                            // Why does it need x and y? Maybe some shaders (eg TexExtr?) need it?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, dudx, dudy, dvdx, dvdy);

                        } else
                        { // We use vertex-coloring
                            // Why does it need x and y?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, 0, 0, 0, 0);
                        }

                        // clamp bytes to 255
                        // Todo: Proper casting (rounding?)? And we don't clamp/max against 255? Use
                        // glm::clamp?
                        const unsigned char red =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[0], T(1)));
                        const unsigned char green =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[1], T(1)));
                        const unsigned char blue =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[2], T(1)));
                        const unsigned char alpha =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[3], T(1)));

                        // update buffers
                        colorbuffer(pixel_index_row, pixel_index_col)[0] = blue;
                        colorbuffer(pixel_index_row, pixel_index_col)[1] = green;
                        colorbuffer(pixel_index_row, pixel_index_col)[2] = red;
                        colorbuffer(pixel_index_row, pixel_index_col)[3] = alpha;
                        if (enable_depth_test) // TODO: A better name for this might be enable_zbuffer? or
                                               // enable_zbuffer_test?
                        {
                            depthbuffer(pixel_index_row, pixel_index_col) = z_affine;
                        }
                    }
                }
            }
        }
    }